

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::AndroidPowerConfig::AndroidPowerConfig(AndroidPowerConfig *this)

{
  AndroidPowerConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__AndroidPowerConfig_009c13b0;
  this->battery_poll_ms_ = 0;
  std::
  vector<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
  ::vector(&this->battery_counters_);
  this->collect_power_rails_ = false;
  this->collect_energy_estimation_breakdown_ = false;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<5UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

AndroidPowerConfig::AndroidPowerConfig() = default;